

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_fixed.cc
# Opt level: O0

string * __thiscall
absl::lts_20250127::time_internal::cctz::FixedOffsetToName_abi_cxx11_
          (string *__return_storage_ptr__,cctz *this,seconds *offset)

{
  cctz *pcVar1;
  bool bVar2;
  int iVar3;
  rep rVar4;
  char *pcVar5;
  char local_d9;
  bool local_b9;
  allocator<char> local_91;
  char *local_90;
  char *ep;
  char buf [19];
  size_t prefix_len;
  int offset_hours;
  int offset_minutes;
  char sign;
  int offset_seconds;
  duration<long,_std::ratio<3600L,_1L>_> local_50;
  int local_44;
  duration<long,_std::ratio<3600L,_1L>_> local_40 [3];
  allocator<char> local_21;
  duration<long,_std::ratio<1L,_1L>_> local_20;
  cctz *local_18;
  seconds *offset_local;
  
  local_18 = this;
  offset_local = (seconds *)__return_storage_ptr__;
  local_20 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::zero();
  bVar2 = std::chrono::operator==((duration<long,_std::ratio<1L,_1L>_> *)this,&local_20);
  pcVar1 = local_18;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"UTC",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  else {
    local_44 = -0x18;
    std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>
              ((duration<long,std::ratio<3600l,1l>> *)local_40,&local_44);
    bVar2 = std::chrono::operator<((duration<long,_std::ratio<1L,_1L>_> *)pcVar1,local_40);
    pcVar1 = local_18;
    local_b9 = true;
    if (!bVar2) {
      offset_seconds = 0x18;
      std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>
                ((duration<long,std::ratio<3600l,1l>> *)&local_50,&offset_seconds);
      local_b9 = std::chrono::operator>((duration<long,_std::ratio<1L,_1L>_> *)pcVar1,&local_50);
    }
    if (local_b9 == false) {
      rVar4 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                        ((duration<long,_std::ratio<1L,_1L>_> *)local_18);
      iVar3 = (int)rVar4;
      local_d9 = '-';
      if (-1 < iVar3) {
        local_d9 = '+';
      }
      prefix_len._4_4_ = iVar3 / 0x3c;
      offset_minutes = iVar3 % 0x3c;
      if (local_d9 == '-') {
        if (0 < offset_minutes) {
          offset_minutes = offset_minutes + -0x3c;
          prefix_len._4_4_ = prefix_len._4_4_ + 1;
        }
        offset_minutes = -offset_minutes;
        prefix_len._4_4_ = -prefix_len._4_4_;
      }
      stack0xffffffffffffff90 = 9;
      pcVar5 = std::copy_n<char_const*,unsigned_long,char*>("Fixed/UTC",9,(char *)&ep);
      local_90 = pcVar5 + 1;
      *pcVar5 = local_d9;
      pcVar5 = anon_unknown_0::Format02d(local_90,prefix_len._4_4_ / 0x3c);
      local_90 = pcVar5 + 1;
      *pcVar5 = ':';
      pcVar5 = anon_unknown_0::Format02d(local_90,prefix_len._4_4_ % 0x3c);
      local_90 = pcVar5 + 1;
      *pcVar5 = ':';
      pcVar5 = anon_unknown_0::Format02d(local_90,offset_minutes);
      local_90 = pcVar5 + 1;
      *pcVar5 = '\0';
      if (local_90 != buf + 0xb) {
        __assert_fail("ep == buf + sizeof(buf)",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/time/internal/cctz/src/time_zone_fixed.cc"
                      ,0x74,
                      "std::string absl::time_internal::cctz::FixedOffsetToName(const seconds &)");
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,(char *)&ep,&local_91);
      std::allocator<char>::~allocator(&local_91);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"UTC",(allocator<char> *)&sign);
      std::allocator<char>::~allocator((allocator<char> *)&sign);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FixedOffsetToName(const seconds& offset) {
  if (offset == seconds::zero()) return "UTC";
  if (offset < std::chrono::hours(-24) || offset > std::chrono::hours(24)) {
    // We don't support fixed-offset zones more than 24 hours
    // away from UTC to avoid complications in rendering such
    // offsets and to (somewhat) limit the total number of zones.
    return "UTC";
  }
  int offset_seconds = static_cast<int>(offset.count());
  const char sign = (offset_seconds < 0 ? '-' : '+');
  int offset_minutes = offset_seconds / 60;
  offset_seconds %= 60;
  if (sign == '-') {
    if (offset_seconds > 0) {
      offset_seconds -= 60;
      offset_minutes += 1;
    }
    offset_seconds = -offset_seconds;
    offset_minutes = -offset_minutes;
  }
  int offset_hours = offset_minutes / 60;
  offset_minutes %= 60;
  const std::size_t prefix_len = sizeof(kFixedZonePrefix) - 1;
  char buf[prefix_len + sizeof("-24:00:00")];
  char* ep = std::copy_n(kFixedZonePrefix, prefix_len, buf);
  *ep++ = sign;
  ep = Format02d(ep, offset_hours);
  *ep++ = ':';
  ep = Format02d(ep, offset_minutes);
  *ep++ = ':';
  ep = Format02d(ep, offset_seconds);
  *ep++ = '\0';
  assert(ep == buf + sizeof(buf));
  return buf;
}